

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall
wasm::Type::hasByteSize::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,Type t)

{
  bool bVar1;
  anon_class_1_0_00000001 *this_local;
  Type t_local;
  
  this_local = (anon_class_1_0_00000001 *)t.id;
  bVar1 = isNumber((Type *)&this_local);
  return bVar1;
}

Assistant:

unsigned Type::hasByteSize() const {
  auto hasSingleByteSize = [](Type t) { return t.isNumber(); };
  if (isTuple()) {
    for (const auto& t : *this) {
      if (!hasSingleByteSize(t)) {
        return false;
      }
    }
    return true;
  }
  return hasSingleByteSize(*this);
}